

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

RealType __thiscall OpenMD::Snapshot::getVolume(Snapshot *this)

{
  long in_RDI;
  double dVar1;
  
  if ((*(byte *)(in_RDI + 0xa7d) & 1) == 0) {
    dVar1 = SquareMatrix3<double>::determinant((SquareMatrix3<double> *)(in_RDI + 0x550));
    *(double *)(in_RDI + 0x800) = dVar1;
    *(undefined1 *)(in_RDI + 0xa7d) = 1;
  }
  return *(RealType *)(in_RDI + 0x800);
}

Assistant:

RealType Snapshot::getVolume() {
    if (!hasVolume) {
      frameData.volume = frameData.hmat.determinant();
      hasVolume        = true;
    }
    return frameData.volume;
  }